

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O1

size_t FSE_normalizeCount(short *normalizedCounter,uint tableLog,uint *count,size_t total,
                         uint maxSymbolValue)

{
  undefined1 auVar1 [16];
  char cVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  byte bVar7;
  ushort uVar8;
  uint uVar9;
  bool bVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  U64 vStepLog;
  
  uVar13 = 0xb;
  if (tableLog != 0) {
    uVar13 = tableLog;
  }
  sVar6 = 0xffffffffffffffff;
  if ((4 < uVar13) && (sVar6 = 0xfffffffffffffffb, uVar13 < 0xd)) {
    uVar4 = (int)total - 1;
    uVar9 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    uVar4 = (uVar9 ^ 0xffffffe0) + 0x21;
    uVar9 = 0x1f;
    if (maxSymbolValue != 0) {
      for (; maxSymbolValue >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    uVar9 = (uVar9 ^ 0xffffffe0) + 0x22;
    if (uVar4 < uVar9) {
      uVar9 = uVar4;
    }
    sVar6 = 0xffffffffffffffff;
    if (uVar9 <= uVar13) {
      bVar3 = (byte)uVar13;
      cVar2 = -bVar3;
      bVar7 = cVar2 + 0x3e;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = total;
      iVar17 = 1 << (bVar3 & 0x1f);
      uVar14 = 0;
      uVar5 = 0;
      uVar9 = 0;
      iVar18 = iVar17;
      do {
        uVar20 = (ulong)uVar9;
        uVar12 = (ulong)count[uVar20];
        if (uVar12 == total) {
          return 0;
        }
        uVar4 = (uint)(total >> (bVar3 & 0x3f));
        if (uVar12 == 0) {
          normalizedCounter[uVar20] = 0;
        }
        else if (uVar4 < count[uVar20]) {
          uVar12 = uVar12 * SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x4000000000000000)) / auVar1,0);
          uVar16 = uVar12 >> (bVar7 & 0x3f);
          if ((uVar16 & 0xfff8) == 0) {
            uVar16 = (ulong)((int)uVar16 +
                            (uint)((ulong)FSE_normalizeCount::rtbTable[uVar16 & 0xffff] <<
                                   (cVar2 + 0x2aU & 0x3f) <
                                  uVar12 - ((uVar16 & 0xffff) << (bVar7 & 0x3f))));
          }
          uVar8 = (ushort)uVar16;
          if ((ushort)uVar14 < uVar8) {
            uVar5 = uVar20;
          }
          if ((ushort)uVar14 < uVar8) {
            uVar14 = uVar16 & 0xffff;
          }
          normalizedCounter[uVar20] = uVar8;
          iVar18 = iVar18 - (int)(uVar16 & 0xffff);
        }
        else {
          normalizedCounter[uVar20] = -1;
          iVar18 = iVar18 + -1;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 <= maxSymbolValue);
      iVar15 = (int)normalizedCounter[uVar5] >> 1;
      sVar6 = (ulong)uVar13;
      if (iVar15 == -iVar18 || SBORROW4(iVar15,-iVar18) != iVar15 + iVar18 < 0) {
        uVar12 = total * 3 >> (bVar3 + 1 & 0x3f);
        uVar9 = maxSymbolValue + 1;
        uVar14 = (ulong)(maxSymbolValue + 1 + (uint)(uVar9 == 0));
        uVar5 = 0;
        uVar19 = 0;
        do {
          uVar11 = count[uVar5];
          if ((ulong)uVar11 == 0) {
            normalizedCounter[uVar5] = 0;
          }
          else {
            if (uVar4 < uVar11) {
              if ((uint)uVar12 < uVar11) {
                normalizedCounter[uVar5] = -2;
                goto LAB_0017edbd;
              }
              normalizedCounter[uVar5] = 1;
            }
            else {
              normalizedCounter[uVar5] = -1;
            }
            uVar19 = uVar19 + 1;
            total = total - uVar11;
          }
LAB_0017edbd:
          uVar5 = uVar5 + 1;
        } while (uVar14 != uVar5);
        uVar4 = iVar17 - uVar19;
        uVar5 = (ulong)uVar4;
        if ((uVar12 & 0xffffffff) < total / uVar5) {
          uVar5 = total * 3;
          uVar12 = 0;
          do {
            if ((normalizedCounter[uVar12] == -2) &&
               (uVar11 = count[uVar12], uVar11 <= (uint)(uVar5 / (uVar4 * 2)))) {
              normalizedCounter[uVar12] = 1;
              uVar19 = uVar19 + 1;
              total = total - uVar11;
            }
            uVar12 = uVar12 + 1;
          } while (uVar14 != uVar12);
          uVar5 = (ulong)(iVar17 - uVar19);
        }
        if (uVar19 == uVar9) {
          uVar12 = 0;
          uVar9 = 0;
          uVar4 = 0;
          do {
            uVar19 = count[uVar12];
            uVar11 = uVar4;
            if (uVar4 < uVar19) {
              uVar11 = uVar19;
            }
            if (uVar4 < uVar19) {
              uVar9 = (uint)uVar12;
            }
            uVar12 = uVar12 + 1;
            uVar4 = uVar11;
          } while (uVar14 != uVar12);
          normalizedCounter[uVar9] = normalizedCounter[uVar9] + (short)uVar5;
          uVar14 = 0;
        }
        else if (total == 0) {
          uVar14 = 0;
          if ((int)uVar5 != 0) {
            uVar12 = 0;
            do {
              if (0 < normalizedCounter[uVar12]) {
                uVar5 = (ulong)((int)uVar5 - 1);
                normalizedCounter[uVar12] = normalizedCounter[uVar12] + 1;
              }
              uVar12 = (ulong)((int)uVar12 + 1) % (ulong)uVar9;
            } while ((int)uVar5 != 0);
          }
        }
        else {
          uVar14 = ~(-1L << (cVar2 + 0x3dU & 0x3f));
          uVar5 = (uVar5 << (bVar7 & 0x3f)) + uVar14;
          uVar9 = 0;
          bVar10 = true;
          do {
            if (normalizedCounter[uVar9] == -2) {
              uVar12 = uVar14 >> (bVar7 & 0x3f);
              uVar14 = (ulong)count[uVar9] * (uVar5 / total) + uVar14;
              uVar20 = uVar14 >> (bVar7 & 0x3f);
              if (uVar20 == uVar12) break;
              normalizedCounter[uVar9] = (short)uVar20 - (short)uVar12;
            }
            uVar9 = uVar9 + 1;
            bVar10 = uVar9 <= maxSymbolValue;
          } while (uVar9 <= maxSymbolValue);
          uVar14 = -(ulong)bVar10;
        }
        if (0xfffffffffffffff7 < uVar14) {
          sVar6 = uVar14;
        }
      }
      else {
        normalizedCounter[uVar5] = normalizedCounter[uVar5] + (short)iVar18;
      }
    }
  }
  return sVar6;
}

Assistant:

size_t FSE_normalizeCount (short* normalizedCounter, unsigned tableLog,
                           const unsigned* count, size_t total,
                           unsigned maxSymbolValue)
{
    /* Sanity checks */
    if (tableLog==0) tableLog = FSE_DEFAULT_TABLELOG;
    if (tableLog < FSE_MIN_TABLELOG) return ERROR(GENERIC);   /* Unsupported size */
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);   /* Unsupported size */
    if (tableLog < FSE_minTableLog(total, maxSymbolValue)) return ERROR(GENERIC);   /* Too small tableLog, compression potentially impossible */

    {   static U32 const rtbTable[] = {     0, 473195, 504333, 520860, 550000, 700000, 750000, 830000 };
        U64 const scale = 62 - tableLog;
        U64 const step = ((U64)1<<62) / total;   /* <== here, one division ! */
        U64 const vStep = 1ULL<<(scale-20);
        int stillToDistribute = 1<<tableLog;
        unsigned s;
        unsigned largest=0;
        short largestP=0;
        U32 lowThreshold = (U32)(total >> tableLog);

        for (s=0; s<=maxSymbolValue; s++) {
            if (count[s] == total) return 0;   /* rle special case */
            if (count[s] == 0) { normalizedCounter[s]=0; continue; }
            if (count[s] <= lowThreshold) {
                normalizedCounter[s] = -1;
                stillToDistribute--;
            } else {
                short proba = (short)((count[s]*step) >> scale);
                if (proba<8) {
                    U64 restToBeat = vStep * rtbTable[proba];
                    proba += (count[s]*step) - ((U64)proba<<scale) > restToBeat;
                }
                if (proba > largestP) { largestP=proba; largest=s; }
                normalizedCounter[s] = proba;
                stillToDistribute -= proba;
        }   }
        if (-stillToDistribute >= (normalizedCounter[largest] >> 1)) {
            /* corner case, need another normalization method */
            size_t const errorCode = FSE_normalizeM2(normalizedCounter, tableLog, count, total, maxSymbolValue);
            if (FSE_isError(errorCode)) return errorCode;
        }
        else normalizedCounter[largest] += (short)stillToDistribute;
    }

#if 0
    {   /* Print Table (debug) */
        U32 s;
        U32 nTotal = 0;
        for (s=0; s<=maxSymbolValue; s++)
            RAWLOG(2, "%3i: %4i \n", s, normalizedCounter[s]);
        for (s=0; s<=maxSymbolValue; s++)
            nTotal += abs(normalizedCounter[s]);
        if (nTotal != (1U<<tableLog))
            RAWLOG(2, "Warning !!! Total == %u != %u !!!", nTotal, 1U<<tableLog);
        getchar();
    }
#endif

    return tableLog;
}